

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O0

MeasureUnit * __thiscall icu_63::MeasureUnit::operator=(MeasureUnit *this,MeasureUnit *other)

{
  MeasureUnit *other_local;
  MeasureUnit *this_local;
  
  if (this != other) {
    this->fTypeId = other->fTypeId;
    this->fSubTypeId = other->fSubTypeId;
    strcpy(this->fCurrency,other->fCurrency);
  }
  return this;
}

Assistant:

MeasureUnit &MeasureUnit::operator=(const MeasureUnit &other) {
    if (this == &other) {
        return *this;
    }
    fTypeId = other.fTypeId;
    fSubTypeId = other.fSubTypeId;
    uprv_strcpy(fCurrency, other.fCurrency);
    return *this;
}